

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O0

float ComputeConeParameter
                (float distance,float angle,float innerAngle,float outerAngle,float innerParam,
                float outerParam)

{
  float fVar1;
  float alpha;
  float halfOuterAngle;
  float halfInnerAngle;
  float outerParam_local;
  float innerParam_local;
  float outerAngle_local;
  float innerAngle_local;
  float angle_local;
  float distance_local;
  float local_4;
  
  if ((((((innerAngle != 0.0) || (NAN(innerAngle))) || (outerAngle != 0.0)) ||
       (local_4 = outerParam, NAN(outerAngle))) &&
      (((local_4 = innerParam, innerAngle != 6.2831855 || (NAN(innerAngle))) ||
       ((outerAngle != 6.2831855 || (NAN(outerAngle))))))) &&
     (((fVar1 = innerAngle / 2.0, 1e-07 < distance && (fVar1 < angle)) &&
      (local_4 = outerParam, angle <= outerAngle / 2.0)))) {
    fVar1 = (angle - fVar1) / (outerAngle / 2.0 - fVar1);
    local_4 = (1.0 - fVar1) * innerParam + fVar1 * outerParam;
  }
  return local_4;
}

Assistant:

static inline float ComputeConeParameter(
	float distance,
	float angle,
	float innerAngle,
	float outerAngle,
	float innerParam,
	float outerParam
) {
	/* When computing whether a point lies inside a cone, X3DAUDIO first determines
	 * whether the point is close enough to the apex of the cone.
	 * If it is, the innerParam is used.
	 * The following constant is the one that is used for this distance check;
	 * It is an approximation, found by manual binary search.
	 * TODO: find the exact value of the constant via automated binary search. */
	#define CONE_NULL_DISTANCE_TOLERANCE 1e-7

	float halfInnerAngle, halfOuterAngle, alpha;

	/* Quote X3DAudio.h:
	 * "Set both cone angles to 0 or X3DAUDIO_2PI for omnidirectionality using
	 * only the outer or inner values respectively."
	 */
	if (innerAngle == 0.0f && outerAngle == 0.0f)
	{
		return outerParam;
	}
	if (innerAngle == F3DAUDIO_2PI && outerAngle == F3DAUDIO_2PI)
	{
		return innerParam;
	}

	/* If we're within the inner angle, or close enough to the apex, we use
	 * the innerParam. */
	halfInnerAngle = innerAngle / 2.0f;
	if (distance <= CONE_NULL_DISTANCE_TOLERANCE || angle <= halfInnerAngle)
	{
		return innerParam;
	}

	/* If we're between the inner angle and the outer angle, we must use
	 * some interpolation of the innerParam and outerParam according to the
	 * distance between our angle and the inner and outer angles.
	 */
	halfOuterAngle = outerAngle / 2.0f;
	if (angle <= halfOuterAngle)
	{
		alpha = (angle - halfInnerAngle) / (halfOuterAngle - halfInnerAngle);

		/* Sooo... This is awkward. MSDN doesn't say anything, but
		 * X3DAudio.h says that this should be lerped. However in
		 * practice the behaviour of X3DAudio isn't a lerp at all. It's
		 * easy to see with big (InnerAngle / OuterAngle) values. If we
		 * want accurate emulation, we'll need to either find what
		 * formula they use, or use a more advanced interpolation, like
		 * tricubic.
		 *
		 * TODO: HIGH_ACCURACY version.
		 * -Adrien
		 */
		return LERP(alpha, innerParam, outerParam);
	}

	/* Otherwise, we're outside the outer angle, so we just return the outer param. */
	return outerParam;
}